

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

void __thiscall cimg_library::CImgDisplay::_map_window(CImgDisplay *this)

{
  byte bVar1;
  byte bVar2;
  Display *pDVar3;
  XWindowAttributes attr;
  XEvent event;
  timespec local_180;
  int local_170;
  int local_16c;
  int local_114;
  int local_e8 [48];
  
  if (cimg::X11_attr()::val == '\0') {
    _map_window();
  }
  pDVar3 = cimg::X11_attr::val.display;
  XMapRaised(cimg::X11_attr::val.display,this->_window);
  bVar2 = 0;
  bVar1 = 0;
  do {
    XWindowEvent(pDVar3,this->_window,0x28000,local_e8);
    if (local_e8[0] == 0xc) {
      bVar2 = 1;
    }
    else if (local_e8[0] == 0x13) {
      bVar1 = 1;
    }
  } while (!(bool)(bVar2 & bVar1));
  do {
    XGetWindowAttributes(pDVar3,this->_window,&local_170);
    if (local_114 != 2) {
      XSync(pDVar3);
      local_180.tv_sec = 0;
      local_180.tv_nsec = 10000000;
      nanosleep(&local_180,(timespec *)0x0);
    }
  } while (local_114 != 2);
  this->_window_x = local_170;
  this->_window_y = local_16c;
  return;
}

Assistant:

void _map_window() {
      Display *const dpy = cimg::X11_attr().display;
      bool is_exposed = false, is_mapped = false;
      XWindowAttributes attr;
      XEvent event;
      XMapRaised(dpy,_window);
      do { // Wait for the window to be mapped.
        XWindowEvent(dpy,_window,StructureNotifyMask | ExposureMask,&event);
        switch (event.type) {
        case MapNotify : is_mapped = true; break;
        case Expose : is_exposed = true; break;
        }
      } while (!is_exposed || !is_mapped);
      do { // Wait for the window to be visible.
        XGetWindowAttributes(dpy,_window,&attr);
        if (attr.map_state!=IsViewable) { XSync(dpy,False); cimg::sleep(10); }
      } while (attr.map_state!=IsViewable);
      _window_x = attr.x;
      _window_y = attr.y;
    }